

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeDebugDeclare
          (ScalarReplacementPass *this,Instruction *dbg_decl,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  IRContext *this_00;
  uint32_t uVar1;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  DebugInfoManager *pDVar4;
  ConstantManager *this_01;
  ulong uVar5;
  Instruction *insert_before;
  pointer ppIVar6;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_b4;
  pointer local_b0;
  Instruction *local_a8;
  Instruction *local_a0;
  pointer local_98;
  ulong local_90;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  pDVar2 = IRContext::get_def_use_mgr((this->super_MemPass).super_Pass.context_);
  local_a0 = dbg_decl;
  uVar1 = Instruction::GetSingleWordOperand(dbg_decl,6);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
  pDVar4 = IRContext::get_debug_info_mgr((this->super_MemPass).super_Pass.context_);
  local_a8 = analysis::DebugInfoManager::DerefDebugExpression(pDVar4,pIVar3);
  local_b0 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = 0;
  ppIVar6 = (replacements->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  while (ppIVar6 != local_b0) {
    pIVar3 = *ppIVar6;
    insert_before = pIVar3;
    do {
      insert_before =
           (insert_before->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((insert_before->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false
         ) {
        insert_before = (Instruction *)0x0;
      }
    } while (insert_before->opcode_ == OpVariable);
    pDVar4 = IRContext::get_debug_info_mgr((this->super_MemPass).super_Pass.context_);
    uVar1 = Instruction::result_id(pIVar3);
    pIVar3 = analysis::DebugInfoManager::AddDebugValueForDecl
                       (pDVar4,local_a0,uVar1,insert_before,local_a0);
    if (pIVar3 == (Instruction *)0x0) break;
    local_98 = ppIVar6;
    this_01 = IRContext::get_constant_mgr((this->super_MemPass).super_Pass.context_);
    local_90 = uVar5;
    local_b4 = analysis::ConstantManager::GetSIntConstId(this_01,(int32_t)uVar5);
    init_list._M_len = 1;
    init_list._M_array = &local_b4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    local_88.type = SPV_OPERAND_TYPE_ID;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&pIVar3->operands_,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    local_58._vptr_SmallVector._0_4_ = Instruction::result_id(local_a8);
    init_list_00._M_len = 1;
    init_list_00._M_array = (iterator)&local_58;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&local_88,init_list_00);
    Instruction::SetOperand(pIVar3,6,(OperandData *)&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&local_88)
    ;
    this_00 = (this->super_MemPass).super_Pass.context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      pDVar2 = IRContext::get_def_use_mgr(this_00);
      analysis::DefUseManager::AnalyzeInstUse(pDVar2,pIVar3);
    }
    uVar5 = (ulong)((int)local_90 + 1);
    ppIVar6 = local_98 + 1;
  }
  return ppIVar6 == local_b0;
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeDebugDeclare(
    Instruction* dbg_decl, const std::vector<Instruction*>& replacements) {
  // Insert Deref operation to the front of the operation list of |dbg_decl|.
  Instruction* dbg_expr = context()->get_def_use_mgr()->GetDef(
      dbg_decl->GetSingleWordOperand(kDebugValueOperandExpressionIndex));
  auto* deref_expr =
      context()->get_debug_info_mgr()->DerefDebugExpression(dbg_expr);

  // Add DebugValue instruction with Indexes operand and Deref operation.
  int32_t idx = 0;
  for (const auto* var : replacements) {
    Instruction* insert_before = var->NextNode();
    while (insert_before->opcode() == spv::Op::OpVariable)
      insert_before = insert_before->NextNode();
    assert(insert_before != nullptr && "unexpected end of list");
    Instruction* added_dbg_value =
        context()->get_debug_info_mgr()->AddDebugValueForDecl(
            dbg_decl, /*value_id=*/var->result_id(),
            /*insert_before=*/insert_before, /*scope_and_line=*/dbg_decl);

    if (added_dbg_value == nullptr) return false;
    added_dbg_value->AddOperand(
        {SPV_OPERAND_TYPE_ID,
         {context()->get_constant_mgr()->GetSIntConstId(idx)}});
    added_dbg_value->SetOperand(kDebugValueOperandExpressionIndex,
                                {deref_expr->result_id()});
    if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse)) {
      context()->get_def_use_mgr()->AnalyzeInstUse(added_dbg_value);
    }
    ++idx;
  }
  return true;
}